

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

string_t * __thiscall
pugi::xpath_query::evaluate_string_abi_cxx11_
          (string_t *__return_storage_ptr__,xpath_query *this,xpath_node *n)

{
  size_t sVar1;
  undefined8 *puVar2;
  xpath_string r;
  xpath_context c;
  xpath_stack_data sd;
  
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    c.n._node._root = (n->_node)._root;
    c.n._attribute._attr = (n->_attribute)._attr;
    c.position = 1;
    sd.result._error = &sd.oom;
    sd.result._root = sd.blocks;
    sd.result._root_size = 0;
    sd.stack.temp = &sd.temp;
    sd.temp._root = sd.blocks + 1;
    sd.temp._root_size = 0;
    sd.oom = false;
    sd.blocks[1].next = (xpath_memory_block *)0x0;
    c.size = 1;
    sd.blocks[0].next = (xpath_memory_block *)0x0;
    sd.stack.result = &sd.result;
    sd.blocks[1].capacity = 0x1000;
    sd.blocks[0].capacity = 0x1000;
    sd.temp._error = sd.result._error;
    impl::anon_unknown_0::xpath_ast_node::eval_string(&r,*this->_impl,&c,&sd.stack);
    if (sd.oom == true) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::__cxx11::string::resize;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    sVar1 = impl::anon_unknown_0::xpath_string::length(&r);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,r._buffer,r._buffer + sVar1);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&sd);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN string_t xpath_query::evaluate_string(const xpath_node& n) const
	{
		if (!_impl) return string_t();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return string_t();
		#else
			throw std::bad_alloc();
		#endif
		}

		return string_t(r.c_str(), r.length());
	}